

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O0

int nni_pipe_alloc_listener(void **datap,nni_listener *l)

{
  nni_pipe *local_40;
  nni_pipe *p;
  nni_sock *s;
  nni_sp_tran *tran;
  nni_listener *pnStack_20;
  int rv;
  nni_listener *l_local;
  void **datap_local;
  
  s = (nni_sock *)l->l_tran;
  p = (nni_pipe *)l->l_sock;
  pnStack_20 = l;
  l_local = (nni_listener *)datap;
  datap_local._4_4_ = pipe_create(&local_40,(nni_sock *)p,(nni_sp_tran *)s,(nni_dialer *)0x0,l);
  if (datap_local._4_4_ == 0) {
    (l_local->l_ops).l_size = (size_t)local_40->p_tran_data;
    datap_local._4_4_ = 0;
  }
  return datap_local._4_4_;
}

Assistant:

int
nni_pipe_alloc_listener(void **datap, nni_listener *l)
{
	int          rv;
	nni_sp_tran *tran = l->l_tran;
	nni_sock    *s    = l->l_sock;
	nni_pipe    *p;

	if ((rv = pipe_create(&p, s, tran, NULL, l)) != 0) {
		return (rv);
	}
	*datap = p->p_tran_data;
	return (0);
}